

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateConstructorAccess
          (ExpressionContext *ctx,SynBase *source,ArrayView<FunctionData_*> functions,
          ExprBase *context)

{
  FunctionData *pFVar1;
  TypeFunction *pTVar2;
  int iVar3;
  undefined4 extraout_var;
  TypeFunctionSet *pTVar4;
  ExprFunctionAccess *this;
  undefined4 extraout_var_01;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ArrayView<TypeBase_*> setTypes;
  IntrusiveList<FunctionHandle> handles;
  SmallArray<TypeBase_*,_16U> types;
  IntrusiveList<FunctionHandle> local_d8;
  SmallArray<TypeBase_*,_16U> local_c8;
  FunctionHandle *node;
  undefined4 extraout_var_00;
  
  uVar5 = functions.count;
  if (uVar5 < 2) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    this = (ExprFunctionAccess *)CONCAT44(extraout_var_01,iVar3);
    if (uVar5 != 1) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x22a,
                    "T &ArrayView<FunctionData *>::operator[](unsigned int) [T = FunctionData *]");
    }
    pFVar1 = *functions.data;
    ExprFunctionAccess::ExprFunctionAccess(this,source,&pFVar1->type->super_TypeBase,pFVar1,context)
    ;
  }
  else {
    local_c8.allocator = ctx->allocator;
    local_c8.data = local_c8.little;
    local_c8.count = 0;
    local_c8.max = 0x10;
    local_d8.head = (FunctionHandle *)0x0;
    local_d8.tail = (FunctionHandle *)0x0;
    uVar7 = 0;
    do {
      pFVar1 = functions.data[uVar7];
      pTVar2 = pFVar1->type;
      if (local_c8.count == local_c8.max) {
        SmallArray<TypeBase_*,_16U>::grow(&local_c8,local_c8.count);
      }
      if (local_c8.data == (TypeBase **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<TypeBase *, 16>::push_back(const T &) [T = TypeBase *, N = 16]"
                     );
      }
      uVar6 = (ulong)local_c8.count;
      local_c8.count = local_c8.count + 1;
      local_c8.data[uVar6] = &pTVar2->super_TypeBase;
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      node = (FunctionHandle *)CONCAT44(extraout_var,iVar3);
      node->function = pFVar1;
      node->next = (FunctionHandle *)0x0;
      node->listed = false;
      IntrusiveList<FunctionHandle>::push_back(&local_d8,node);
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
    setTypes.count = local_c8.count;
    setTypes.data = local_c8.data;
    setTypes._12_4_ = 0;
    pTVar4 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (ExprFunctionAccess *)CONCAT44(extraout_var_00,iVar3);
    (this->super_ExprBase).typeID = 0x27;
    (this->super_ExprBase).source = source;
    (this->super_ExprBase).type = &pTVar4->super_TypeBase;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6980;
    this->function = (FunctionData *)local_d8.head;
    this->context = (ExprBase *)local_d8.tail;
    this[1].super_ExprBase._vptr_ExprBase = (_func_int **)context;
    SmallArray<TypeBase_*,_16U>::~SmallArray(&local_c8);
  }
  return &this->super_ExprBase;
}

Assistant:

ExprBase* CreateConstructorAccess(ExpressionContext &ctx, SynBase *source, ArrayView<FunctionData*> functions, ExprBase *context)
{
	if(functions.size() > 1)
	{
		SmallArray<TypeBase*, 16> types(ctx.allocator);
		IntrusiveList<FunctionHandle> handles;

		for(unsigned i = 0; i < functions.size(); i++)
		{
			FunctionData *curr = functions[i];

			types.push_back(curr->type);
			handles.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(curr));
		}

		TypeFunctionSet *type = ctx.GetFunctionSetType(types);

		return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, handles, context);
	}

	return new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, functions[0]->type, functions[0], context);
}